

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void cs_base64_update(cs_base64_ctx *ctx,char *str,size_t len)

{
  uchar uVar1;
  int iVar2;
  uchar *src;
  size_t sVar3;
  
  if (len != 0) {
    iVar2 = ctx->chunk_size;
    sVar3 = 0;
    do {
      uVar1 = str[sVar3];
      ctx->chunk_size = iVar2 + 1;
      ctx->chunk[iVar2] = uVar1;
      iVar2 = ctx->chunk_size;
      if (iVar2 == 3) {
        cs_base64_emit_chunk(ctx);
        ctx->chunk_size = 0;
        iVar2 = 0;
      }
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  return;
}

Assistant:

void cs_base64_update(struct cs_base64_ctx *ctx, const char *str, size_t len) {
    const unsigned char *src = (const unsigned char *) str;
    size_t i;
    for (i = 0; i < len; i++) {
        ctx->chunk[ctx->chunk_size++] = src[i];
        if (ctx->chunk_size == 3) {
            cs_base64_emit_chunk(ctx);
            ctx->chunk_size = 0;
        }
    }
}